

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O0

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkTryFinally
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNodeTryFinally *pnode,Context context)

{
  bool bVar1;
  ResultType local_21;
  ResultType result;
  Context context_local;
  ParseNodeTryFinally *pnode_local;
  ParseNodeWalker<WalkerPolicyTest> *this_local;
  
  local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkFirstChild
                       ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                        (ParseNode *)pnode->pnodeTry,context);
  bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                    (&this->super_WalkerPolicyTest,local_21);
  if (bVar1) {
    local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNode
                         ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                          (ParseNode *)pnode,context);
    bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                      (&this->super_WalkerPolicyTest,local_21);
    if (bVar1) {
      local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkSecondChild
                           ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                            (ParseNode *)pnode->pnodeFinally,context);
    }
  }
  return local_21;
}

Assistant:

ResultType WalkTryFinally(ParseNodeTryFinally *pnode, Context context)
    {
        ResultType result = WalkFirstChild(pnode->pnodeTry, context);
        if (ContinueWalk(result))
        {
            result = WalkNode(pnode, context);
            if (ContinueWalk(result)) result = WalkSecondChild(pnode->pnodeFinally, context);
        }
        return result;
    }